

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O1

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  uint uVar1;
  secp256k1_scalar sVar2;
  ulong uVar3;
  size_t outlen;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  int vflag;
  secp256k1_scalar diff;
  secp256k1_scalar b;
  unsigned_long _zzq_result;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_fe f;
  uchar nonce32 [32];
  secp256k1_gej gb;
  uchar keydata [64];
  secp256k1_scalar local_1fc;
  secp256k1_scalar *local_1f8;
  secp256k1_scalar local_1ec [3];
  secp256k1_scalar *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  secp256k1_rfc6979_hmac_sha256 local_1b8;
  secp256k1_fe local_168;
  uchar local_138 [32];
  secp256k1_gej local_118;
  uchar local_78 [24];
  long lStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  secp256k1_scalar_verify(&secp256k1_scalar_one);
  local_118.x.n[0]._0_4_ = 7;
  secp256k1_scalar_verify((secp256k1_scalar *)&local_118);
  secp256k1_scalar_verify((secp256k1_scalar *)&local_118);
  local_118.x.n[0] = CONCAT44(local_118.x.n[0]._4_4_,6);
  secp256k1_scalar_verify((secp256k1_scalar *)&local_118);
  local_1fc = 1;
  iVar4 = 3;
  do {
    secp256k1_scalar_add(&local_1fc,&local_1fc,&local_1fc);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  secp256k1_scalar_add(&local_1fc,&local_1fc,(secp256k1_scalar *)&local_118);
  if (seed32 == (uchar *)0x0) {
    secp256k1_ge_neg(&ctx->ge_offset,&secp256k1_ge_const_g);
    secp256k1_scalar_add(&ctx->scalar_offset,&secp256k1_scalar_one,&local_1fc);
    (ctx->proj_blind).n[4] = 0;
    (ctx->proj_blind).magnitude = 1;
    (ctx->proj_blind).normalized = 1;
    (ctx->proj_blind).n[2] = 0;
    (ctx->proj_blind).n[3] = 0;
    (ctx->proj_blind).n[0] = 1;
    (ctx->proj_blind).n[1] = 0;
  }
  else {
    local_1f8 = &ctx->scalar_offset;
    secp256k1_scalar_verify(local_1f8);
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    uVar1 = ctx->scalar_offset;
    lStack_60 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18) << 0x20;
    local_58 = *(undefined8 *)seed32;
    uStack_50 = *(undefined8 *)(seed32 + 8);
    local_48 = *(undefined8 *)(seed32 + 0x10);
    uStack_40 = *(undefined8 *)(seed32 + 0x18);
    secp256k1_rfc6979_hmac_sha256_initialize(&local_1b8,local_78,0x40);
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    lStack_60 = 0;
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_118.x.n[0] = 0x4d430001;
    local_118.x.n[2] = 0x40;
    local_118.x.n[3] = 0;
    local_118.x.n[4] = 0;
    local_118.x.magnitude = 0;
    local_118.x.normalized = 0;
    local_1ec[1] = 0;
    local_1ec[2] = 0;
    local_118.x.n[1] = (uint64_t)local_78;
    secp256k1_rfc6979_hmac_sha256_generate(&local_1b8,local_138,0);
    secp256k1_fe_impl_set_b32_mod(&local_168,local_138);
    local_168.magnitude = 1;
    local_168.normalized = 0;
    secp256k1_fe_verify(&local_168);
    secp256k1_fe_verify(&local_168);
    uVar5 = (local_168.n[4] >> 0x30) * 0x1000003d1 + local_168.n[0];
    uVar3 = (uVar5 >> 0x34) + local_168.n[1];
    uVar6 = (uVar3 >> 0x34) + local_168.n[2];
    uVar7 = (uVar6 >> 0x34) + local_168.n[3];
    uVar8 = (uVar7 >> 0x34) + (local_168.n[4] & 0xffffffffffff);
    secp256k1_fe_cmov(&local_168,&secp256k1_fe_one,
                      (uint)(((uVar5 ^ 0x1000003d0) & uVar3 & uVar6 & uVar7 &
                             (uVar8 ^ 0xf000000000000)) == 0xfffffffffffff ||
                            ((uVar3 | uVar5 | uVar6 | uVar7) & 0xfffffffffffff) == 0 && uVar8 == 0))
    ;
    (ctx->proj_blind).n[4] = local_168.n[4];
    (ctx->proj_blind).magnitude = local_168.magnitude;
    (ctx->proj_blind).normalized = local_168.normalized;
    (ctx->proj_blind).n[2] = local_168.n[2];
    (ctx->proj_blind).n[3] = local_168.n[3];
    (ctx->proj_blind).n[0] = local_168.n[0];
    (ctx->proj_blind).n[1] = local_168.n[1];
    secp256k1_rfc6979_hmac_sha256_generate(&local_1b8,local_138,outlen);
    secp256k1_scalar_set_b32(local_1ec,local_138,(int *)0x0);
    secp256k1_scalar_verify(local_1ec);
    bVar9 = local_1ec[0] == 0;
    secp256k1_scalar_verify(&secp256k1_scalar_one);
    local_118.x.n[0] = 0x4d430005;
    local_118.x.n[2] = 4;
    local_118.x.n[3] = 0;
    local_118.x.n[4] = 0;
    local_118.x.magnitude = 0;
    local_118.x.normalized = 0;
    local_1ec[1] = 0;
    local_1ec[2] = 0;
    local_1ec[0] = (uint)bVar9 | bVar9 - 1 & local_1ec[0];
    local_118.x.n[1] = (uint64_t)local_1ec;
    secp256k1_scalar_verify(local_1ec);
    secp256k1_ecmult_gen(ctx,&local_118,local_1ec);
    secp256k1_scalar_verify(local_1ec);
    sVar2 = 0xd - local_1ec[0];
    if (local_1ec[0] == 0) {
      sVar2 = 0;
    }
    local_1ec[0] = sVar2;
    secp256k1_scalar_verify(local_1ec);
    secp256k1_scalar_add(local_1f8,local_1ec,&local_1fc);
    secp256k1_ge_set_gej(&ctx->ge_offset,&local_118);
    local_138[0x10] = '\0';
    local_138[0x11] = '\0';
    local_138[0x12] = '\0';
    local_138[0x13] = '\0';
    local_138[0x14] = '\0';
    local_138[0x15] = '\0';
    local_138[0x16] = '\0';
    local_138[0x17] = '\0';
    local_138[0x18] = '\0';
    local_138[0x19] = '\0';
    local_138[0x1a] = '\0';
    local_138[0x1b] = '\0';
    local_138[0x1c] = '\0';
    local_138[0x1d] = '\0';
    local_138[0x1e] = '\0';
    local_138[0x1f] = '\0';
    local_138[0] = '\0';
    local_138[1] = '\0';
    local_138[2] = '\0';
    local_138[3] = '\0';
    local_138[4] = '\0';
    local_138[5] = '\0';
    local_138[6] = '\0';
    local_138[7] = '\0';
    local_138[8] = '\0';
    local_138[9] = '\0';
    local_138[10] = '\0';
    local_138[0xb] = '\0';
    local_138[0xc] = '\0';
    local_138[0xd] = '\0';
    local_138[0xe] = '\0';
    local_138[0xf] = '\0';
    local_1ec[0] = 0;
    local_1ec[1] = 0x4d430001;
    local_1ec[2] = 0;
    local_1d8 = 4;
    local_1d0 = 0;
    local_1c8 = 0;
    local_1c0 = 0;
    local_1e0 = local_1ec;
    memset(&local_118,0,0x98);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_scalar diff;
    secp256k1_gej gb;
    secp256k1_fe f;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];

    /* Compute the (2^COMB_BITS - 1)/2 term once. */
    secp256k1_ecmult_gen_scalar_diff(&diff);

    if (seed32 == NULL) {
        /* When seed is NULL, reset the final point and blinding value. */
        secp256k1_ge_neg(&ctx->ge_offset, &secp256k1_ge_const_g);
        secp256k1_scalar_add(&ctx->scalar_offset, &secp256k1_scalar_one, &diff);
        ctx->proj_blind = secp256k1_fe_one;
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->scalar_offset);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    secp256k1_memclear(keydata, sizeof(keydata));

    /* Compute projective blinding factor (cannot be 0). */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&f, nonce32);
    secp256k1_fe_cmov(&f, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&f));
    ctx->proj_blind = f;

    /* For a random blinding value b, set scalar_offset=diff-b, ge_offset=bG */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* The blinding value cannot be zero, as that would mean ge_offset = infinity,
     * which secp256k1_gej_add_ge cannot handle. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    secp256k1_scalar_add(&ctx->scalar_offset, &b, &diff);
    secp256k1_ge_set_gej(&ctx->ge_offset, &gb);

    /* Clean up. */
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_clear(&f);
    secp256k1_rfc6979_hmac_sha256_clear(&rng);
}